

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O2

void Abc_SclManFree(SC_Man *p)

{
  uint uVar1;
  int iVar2;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Que_t *pVVar3;
  int *piVar4;
  float *pfVar5;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  int iVar8;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *__ptr_01;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  for (iVar8 = 0; pNtk = p->pNtk, iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
    pAVar6 = Abc_NtkCi(pNtk,iVar8);
    (pAVar6->field_5).iData = 0;
  }
  for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
    pAVar6 = Abc_NtkCo(pNtk,iVar8);
    (pAVar6->field_5).iData = 0;
    pNtk = p->pNtk;
  }
  pNtk->pSCLib = (void *)0x0;
  Vec_IntFreeP(&pNtk->vGates);
  Vec_IntFreeP(&p->vNodeIter);
  Vec_QueFreeP(&p->vNodeByGain);
  Vec_FltFreeP(&p->vNode2Gain);
  Vec_IntFreeP(&p->vNode2Gate);
  Vec_FltFreeP(&p->vLoads2);
  Vec_FltFreeP(&p->vLoads3);
  Vec_FltFreeP(&p->vTimes2);
  Vec_FltFreeP(&p->vTimes3);
  Vec_IntFreeP(&p->vUpdates);
  Vec_IntFreeP(&p->vUpdates2);
  Vec_IntFreeP(&p->vGatesBest);
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    __ptr_01 = __ptr->pArray;
    lVar12 = 8;
    for (lVar11 = 0; lVar11 < __ptr->nCap; lVar11 = lVar11 + 1) {
      __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar12);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        __ptr_01 = __ptr->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    }
    free(__ptr_01);
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  Vec_IntFreeP(&p->vChanged);
  pVVar3 = p->vQue;
  uVar1 = pVVar3->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar8 = pVVar3->nCap;
  if (iVar8 < (int)uVar1) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar9 = (ulong)(uVar1 - 1);
  uVar10 = 0;
  while (uVar7 = uVar9, uVar9 != uVar10) {
    piVar4 = pVVar3->pOrder + uVar10;
    uVar10 = uVar10 + 1;
    if (*piVar4 < 1) {
      __assert_fail("p->pOrder[i] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                    ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  while ((int)uVar7 < iVar8) {
    piVar4 = pVVar3->pOrder + uVar7;
    uVar7 = uVar7 + 1;
    if (*piVar4 != -1) {
      __assert_fail("p->pOrder[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                    ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  piVar4 = pVVar3->pHeap;
  if (*piVar4 == -1) {
    uVar10 = 0xffffffffffffffff;
    while (uVar10 - uVar9 != -1) {
      lVar12 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      if (uVar10 != (uint)piVar4[pVVar3->pOrder[lVar12]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
    }
    lVar12 = 0;
    while ((int)(uVar1 + (int)lVar12) < iVar8) {
      lVar11 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      if (piVar4[uVar9 + lVar11] != -1) {
        __assert_fail("p->pHeap[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                      ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
      }
    }
    lVar12 = 2;
    iVar8 = 3;
    lVar11 = 0x200000000;
    do {
      if ((ulong)uVar1 * 2 == lVar12) {
        Vec_QueFreeP(&p->vQue);
        Vec_FltFreeP(&p->vTimesOut);
        Vec_IntFreeP(&p->vBestFans);
        Vec_FltFreeP(&p->vInDrive);
        Vec_FltFreeP(&p->vWireCaps);
        if (p->pLoads != (SC_Pair *)0x0) {
          free(p->pLoads);
          p->pLoads = (SC_Pair *)0x0;
        }
        if (p->pDepts != (SC_Pair *)0x0) {
          free(p->pDepts);
          p->pDepts = (SC_Pair *)0x0;
        }
        if (p->pTimes != (SC_Pair *)0x0) {
          free(p->pTimes);
          p->pTimes = (SC_Pair *)0x0;
        }
        free(p->pSlews);
        free(p);
        return;
      }
      if ((int)lVar12 < (int)uVar1) {
        iVar2 = *(int *)((long)piVar4 + lVar12 * 2);
        pfVar5 = *pVVar3->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar13 = (float)iVar2;
          fVar14 = (float)*(int *)((long)piVar4 + (lVar11 >> 0x1e));
        }
        else {
          fVar13 = pfVar5[iVar2];
          fVar14 = pfVar5[*(int *)((long)piVar4 + (lVar11 >> 0x1e))];
        }
        if (fVar13 < fVar14) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar8 < (int)uVar1) {
        iVar2 = *(int *)((long)piVar4 + lVar12 * 2);
        pfVar5 = *pVVar3->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar13 = (float)iVar2;
          fVar14 = (float)piVar4[iVar8];
        }
        else {
          fVar13 = pfVar5[iVar2];
          fVar14 = pfVar5[piVar4[iVar8]];
        }
        if (fVar13 < fVar14) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      lVar12 = lVar12 + 2;
      iVar8 = iVar8 + 2;
      lVar11 = lVar11 + 0x200000000;
    } while( true );
  }
  __assert_fail("p->pHeap[0] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                ,300,"void Vec_QueCheck(Vec_Que_t *)");
}

Assistant:

static inline void Abc_SclManFree( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set CI/CO ids
    Abc_NtkForEachCi( p->pNtk, pObj, i )
        pObj->iData = 0;
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        pObj->iData = 0;
    // other
    p->pNtk->pSCLib = NULL;
    Vec_IntFreeP( &p->pNtk->vGates );
    Vec_IntFreeP( &p->vNodeIter );
    Vec_QueFreeP( &p->vNodeByGain );
    Vec_FltFreeP( &p->vNode2Gain );
    Vec_IntFreeP( &p->vNode2Gate );
    // intermediate data
    Vec_FltFreeP( &p->vLoads2 );
    Vec_FltFreeP( &p->vLoads3 );
    Vec_FltFreeP( &p->vTimes2 );
    Vec_FltFreeP( &p->vTimes3 );
    Vec_IntFreeP( &p->vUpdates );
    Vec_IntFreeP( &p->vUpdates2 );
    Vec_IntFreeP( &p->vGatesBest );
    Vec_WecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vChanged );
//    Vec_QuePrint( p->vQue );
    Vec_QueCheck( p->vQue );
    Vec_QueFreeP( &p->vQue );
    Vec_FltFreeP( &p->vTimesOut );
    Vec_IntFreeP( &p->vBestFans );
    Vec_FltFreeP( &p->vInDrive );
    Vec_FltFreeP( &p->vWireCaps );
    ABC_FREE( p->pLoads );
    ABC_FREE( p->pDepts );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pSlews );
    ABC_FREE( p );
}